

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

void __thiscall QBuffer::setData(QBuffer *this,char *data,qsizetype size)

{
  bool bVar1;
  QBufferPrivate *file;
  QMessageLogger *in_RDX;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  QBufferPrivate *d;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QBuffer *)0x273d74);
  bVar1 = QIODevice::isOpen(in_RDI);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)file,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    QMessageLogger::warning(&local_28,"QBuffer::setData: Buffer is open");
  }
  else {
    QByteArray::assign<const_char_*,_true>((QByteArray *)in_RDX,(char *)file,(char *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBuffer::setData(const char *data, qsizetype size)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setData: Buffer is open");
        return;
    }
    d->buf->assign(data, data + size);
}